

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::reduceDB(SAT *this)

{
  uint uVar1;
  Clause **ppCVar2;
  Clause *c;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  ppCVar2 = (this->learnts).data;
  std::__sort<Clause**,__gnu_cxx::__ops::_Iter_comp_iter<activity_lt>>
            (ppCVar2,ppCVar2 + (this->learnts).sz);
  uVar7 = 0;
  uVar9 = 0;
  while( true ) {
    uVar1 = (this->learnts).sz;
    if (uVar1 >> 1 <= uVar7) break;
    bVar3 = locked(this,(this->learnts).data[uVar7]);
    ppCVar2 = (this->learnts).data;
    c = ppCVar2[uVar7];
    if (bVar3) {
      ppCVar2[uVar9] = c;
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    else {
      removeClause(this,c);
    }
    uVar7 = uVar7 + 1;
  }
  uVar5 = uVar7;
  uVar4 = (ulong)uVar1;
  if (uVar1 < uVar7) {
    uVar4 = uVar7;
  }
  for (; uVar8 = (uint)uVar9, uVar5 != uVar4; uVar5 = uVar5 + 1) {
    ppCVar2 = (this->learnts).data;
    ppCVar2[uVar9] = ppCVar2[uVar5];
    uVar9 = (ulong)(uVar8 + 1);
  }
  (this->learnts).sz = uVar8;
  if (so.verbosity < 1) {
    return;
  }
  uVar6 = (uint)uVar7;
  if ((uint)uVar7 < uVar1) {
    uVar6 = uVar1;
  }
  printf("%% Pruned %d learnt clauses\n",(ulong)(uVar6 - uVar8));
  return;
}

Assistant:

void SAT::reduceDB() {
	unsigned int i;
	unsigned int j;

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), activity_lt());

	for (i = j = 0; i < learnts.size() / 2; i++) {
		if (!locked(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	for (; i < learnts.size(); i++) {
		learnts[j++] = learnts[i];
	}
	learnts.resize(j);

	if (so.verbosity >= 1) {
		printf("%% Pruned %d learnt clauses\n", i - j);
	}
}